

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::rr_cache(rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,size_t capacity,float max_load_factor)

{
  pointer puVar1;
  double dVar2;
  uint uVar3;
  long lVar4;
  pointer puVar5;
  ulong uVar6;
  unsigned_long uVar7;
  __hashtable *__this;
  undefined1 auVar8 [16];
  allocator_type local_36;
  allocator_type local_35;
  float local_34;
  
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 8) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_34 = max_load_factor;
  std::
  vector<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,capacity,&local_35);
  (this->m_keyed_elements)._M_h._M_buckets = &(this->m_keyed_elements)._M_h._M_single_bucket;
  (this->m_keyed_elements)._M_h._M_bucket_count = 1;
  (this->m_keyed_elements)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_keyed_elements)._M_h._M_element_count = 0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_keyed_elements)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->m_open_list,capacity,&local_36);
  this->m_open_list_end = 0;
  std::random_device::random_device(&this->m_random_device);
  uVar3 = std::random_device::_M_getval();
  uVar6 = (ulong)uVar3;
  (this->m_mt)._M_x[0] = uVar6;
  lVar4 = 0;
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar4 + 1);
    (this->m_mt)._M_x[lVar4 + 1] = uVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x26f);
  (this->m_mt)._M_p = 0x270;
  puVar5 = (this->m_open_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_open_list).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar1) {
    uVar7 = 0;
    do {
      *puVar5 = uVar7;
      uVar7 = uVar7 + 1;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = local_34;
  auVar8._8_4_ = (int)(capacity >> 0x20);
  auVar8._0_8_ = capacity;
  auVar8._12_4_ = 0x45300000;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  dVar2 = ceil(((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)capacity) - 4503599627370496.0)) / (double)local_34
              );
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->m_keyed_elements)._M_h,
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  return;
}

Assistant:

explicit rr_cache(size_t capacity, float max_load_factor = 1.0f)
        : m_elements(capacity),
          m_open_list(capacity),
          m_random_device(),
          m_mt(m_random_device())
    {
        std::iota(m_open_list.begin(), m_open_list.end(), 0);

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }